

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* readModifiers_abi_cxx11_
            (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,XMLNode *node)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__s;
  size_type __pos;
  size_type __pos_00;
  bool condition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  string local_b8;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arraySizes;
  string bitCount;
  
  arraySizes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bitCount._M_dataplus._M_p = (pointer)&bitCount.field_2;
  bitCount._M_string_length = 0;
  arraySizes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arraySizes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bitCount.field_2._M_local_buf[0] = '\0';
  if (node == (XMLNode *)0x0) goto LAB_001942d4;
  iVar2 = (*node->_vptr_XMLNode[7])(node);
  if (CONCAT44(extraout_var,iVar2) == 0) goto LAB_001942d4;
  __s = tinyxml2::XMLNode::Value(node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,__s,(allocator<char> *)&bStack_d8);
  trim(&value,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (value._M_string_length == 0) {
    __assert_fail("!value.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                  ,0x147,
                  "std::pair<std::vector<std::string>, std::string> readModifiers(const tinyxml2::XMLNode *)"
                 );
  }
  cVar1 = *value._M_dataplus._M_p;
  condition = true;
  if (cVar1 == ')') goto LAB_00194274;
  if (cVar1 == ':') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&bStack_d8,&value,1,0xffffffffffffffff);
    trim(&local_b8,&bStack_d8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&bitCount,&local_b8);
LAB_001942b5:
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&bStack_d8);
  }
  else {
    if (cVar1 == ';') {
LAB_00194274:
      iVar2 = node->_parseLineNum;
      std::operator+(&bStack_d8,"unknown modifier <",&value);
      std::operator+(&local_b8,&bStack_d8,">");
      checkForError(condition,iVar2,&local_b8);
      goto LAB_001942b5;
    }
    if (cVar1 != '[') {
      condition = false;
      goto LAB_00194274;
    }
    __pos_00 = 0;
    while (__pos_00 + 1 != value._M_string_length) {
      __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&value,'[',__pos_00);
      iVar2 = node->_parseLineNum;
      std::operator+(&bStack_d8,"could not find \'[\' in <",&value);
      std::operator+(&local_b8,&bStack_d8,">");
      checkForError(__pos != 0xffffffffffffffff,iVar2,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&bStack_d8);
      __pos_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(&value,']',__pos);
      iVar2 = node->_parseLineNum;
      std::operator+(&bStack_d8,"could not find \']\' in <",&value);
      std::operator+(&local_b8,&bStack_d8,">");
      checkForError(__pos_00 != 0xffffffffffffffff,iVar2,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&bStack_d8);
      iVar2 = node->_parseLineNum;
      std::operator+(&bStack_d8,"missing content between \'[\' and \']\' in <",&value);
      std::operator+(&local_b8,&bStack_d8,">");
      checkForError(__pos + 2 <= __pos_00,iVar2,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&bStack_d8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b8,&value,__pos + 1,~__pos + __pos_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arraySizes,
                 &local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  std::__cxx11::string::~string((string *)&value);
LAB_001942d4:
  std::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (__return_storage_ptr__,&arraySizes,&bitCount);
  std::__cxx11::string::~string((string *)&bitCount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arraySizes);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::vector<std::string>, std::string> readModifiers( tinyxml2::XMLNode const * node )
{
  std::vector<std::string> arraySizes;
  std::string              bitCount;
  if ( node && node->ToText() )
  {
    // following the name there might be some array size
    std::string value = trim( node->Value() );
    assert( !value.empty() );
    if ( value[0] == '[' )
    {
      std::string::size_type endPos = 0;
      while ( endPos + 1 != value.length() )
      {
        const std::string::size_type startPos = value.find( '[', endPos );
        checkForError( startPos != std::string::npos, node->GetLineNum(), "could not find '[' in <" + value + ">" );
        endPos = value.find( ']', startPos );
        checkForError( endPos != std::string::npos, node->GetLineNum(), "could not find ']' in <" + value + ">" );
        checkForError( startPos + 2 <= endPos, node->GetLineNum(), "missing content between '[' and ']' in <" + value + ">" );
        arraySizes.push_back( value.substr( startPos + 1, endPos - startPos - 1 ) );
      }
    }
    else if ( value[0] == ':' )
    {
      bitCount = trim( value.substr( 1 ) );
    }
    else
    {
      checkForError( ( value[0] == ';' ) || ( value[0] == ')' ), node->GetLineNum(), "unknown modifier <" + value + ">" );
    }
  }
  return { arraySizes, bitCount };
}